

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.hpp
# Opt level: O0

token __thiscall
wigwag::
signal<void(),wigwag::exception_handling::none,wigwag::threading::none,wigwag::state_populating::none,wigwag::life_assurance::none,wigwag::creation::lazy,wigwag::ref_counter::single_threaded>
::connect<std::function<void()>>
          (signal<void(),wigwag::exception_handling::none,wigwag::threading::none,wigwag::state_populating::none,wigwag::life_assurance::none,wigwag::creation::lazy,wigwag::ref_counter::single_threaded>
           *this,function<void_()> *handler,handler_attributes attributes)

{
  signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::ref_counter::single_threaded>
  *psVar1;
  uint in_ECX;
  undefined4 in_register_00000014;
  function<void_()> local_48;
  uint local_24;
  function<void_()> *pfStack_20;
  handler_attributes attributes_local;
  function<void_()> *handler_local;
  signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>
  *this_local;
  
  local_24 = in_ECX;
  pfStack_20 = (function<void_()> *)CONCAT44(in_register_00000014,attributes);
  handler_local = handler;
  this_local = (signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>
                *)this;
  psVar1 = wigwag::detail::
           creation_storage_adapter<wigwag::creation::lazy::storage<wigwag::detail::intrusive_ptr<wigwag::detail::signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::ref_counter::single_threaded>_>,_wigwag::detail::signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::ref_counter::single_threaded>_>_>
           ::operator->((creation_storage_adapter<wigwag::creation::lazy::storage<wigwag::detail::intrusive_ptr<wigwag::detail::signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::ref_counter::single_threaded>_>,_wigwag::detail::signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::ref_counter::single_threaded>_>_>
                         *)handler);
  std::function<void_()>::function
            (&local_48,(function<void_()> *)CONCAT44(in_register_00000014,attributes));
  (*(psVar1->super_signal_connector_impl<void_()>)._vptr_signal_connector_impl[2])
            (this,psVar1,&local_48,(ulong)local_24);
  std::function<void_()>::~function(&local_48);
  return (token)(implementation *)this;
}

Assistant:

token connect(HandlerFunc_ handler, handler_attributes attributes = handler_attributes::none) const
        { return _impl->connect(std::move(handler), attributes); }